

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::QueueUserAPC
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CPalThread *pthrTarget,
          PAPCFUNC pfnAPC,ULONG_PTR uptrData)

{
  int iVar1;
  bool bVar2;
  PAL_ERROR PVar3;
  undefined8 extraout_RAX;
  int *piVar4;
  PThreadApcInfoNode p_Var5;
  _ThreadApcInfoNode *pobj;
  _ThreadApcInfoNode *local_60;
  _ThreadApcInfoNode *pObj;
  CPalSynchronizationManager *local_50;
  _ThreadApcInfoNode *local_48;
  undefined8 local_40;
  CPalThread *local_38;
  
  pObj = (_ThreadApcInfoNode *)&this->m_cacheThreadApcInfoNodes;
  local_60 = (_ThreadApcInfoNode *)0x0;
  local_50 = this;
  CSynchCache<CorUnix::_ThreadApcInfoNode>::Get
            ((CSynchCache<CorUnix::_ThreadApcInfoNode> *)pObj,pthrCurrent,1,&local_60);
  pobj = local_60;
  local_48 = local_60;
  if (local_60 == (_ThreadApcInfoNode *)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ab25;
    PVar3 = 8;
    local_40 = 0;
  }
  else {
    local_60->pfnAPC = pfnAPC;
    local_60->pAPCData = uptrData;
    local_60->pNext = (_ThreadApcInfoNode *)0x0;
    AcquireLocalSynchLock(pthrCurrent);
    if ((pthrTarget->synchronizationInfo).m_twiWaitInfo.wdWaitDomain == LocalWait) {
      local_40 = 0;
    }
    else {
      AcquireSharedSynchLock(pthrCurrent);
      local_40 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    local_38 = pthrCurrent;
    InternalEnterCriticalSection(pthrCurrent,&pthrTarget->m_csLock);
    if (((pthrTarget->synchronizationInfo).m_tsThreadState == TS_DONE) ||
       (piVar4 = (int *)SHMPtrToPtr((pthrTarget->synchronizationInfo).m_shridWaitAwakened),
       *piVar4 == 3)) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ab25;
      bVar2 = true;
      PVar3 = 0x57;
      pthrCurrent = local_38;
      goto LAB_0013a9d9;
    }
    p_Var5 = (pthrTarget->apcInfo).m_ptainTail;
    if ((p_Var5 == (PThreadApcInfoNode)0x0) &&
       (p_Var5 = (PThreadApcInfoNode)&(pthrTarget->apcInfo).m_ptainHead,
       (pthrTarget->apcInfo).m_ptainHead != (PThreadApcInfoNode)0x0)) {
      fprintf(_stderr,"] %s %s:%d","QueueUserAPC",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x506);
      fprintf(_stderr,
              "Expression: NULL == pthrTarget->apcInfo.m_ptainHead, Description: Corrupted APC list\n"
             );
    }
    pthrCurrent = local_38;
    p_Var5->pNext = local_48;
    (pthrTarget->apcInfo).m_ptainTail = local_48;
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_0013ab25:
      abort();
    }
    PVar3 = 0;
    LOCK();
    iVar1 = *piVar4;
    if (iVar1 == 2) {
      *piVar4 = 0;
    }
    UNLOCK();
    InternalLeaveCriticalSection(local_38,&pthrTarget->m_csLock);
    if (iVar1 == 2) {
      UnRegisterWait(local_50,pthrCurrent,&(pthrTarget->synchronizationInfo).m_twiWaitInfo,
                     (bool)(char)local_40);
      PVar3 = WakeUpLocalThread(pthrCurrent,pthrTarget,Alerted,0);
      if ((PVar3 == 0) || (PAL_InitializeChakraCoreCalled != false)) {
        pobj = (_ThreadApcInfoNode *)0x0;
        bVar2 = false;
        pthrCurrent = local_38;
        goto LAB_0013a9d9;
      }
      goto LAB_0013ab25;
    }
  }
  pobj = (_ThreadApcInfoNode *)0x0;
  bVar2 = false;
LAB_0013a9d9:
  if (bVar2) {
    InternalLeaveCriticalSection(pthrCurrent,&pthrTarget->m_csLock);
  }
  if ((char)local_40 != '\0') {
    ReleaseSharedSynchLock(pthrCurrent);
  }
  if (local_48 != (_ThreadApcInfoNode *)0x0) {
    ReleaseLocalSynchLock(pthrCurrent);
  }
  if (pobj != (_ThreadApcInfoNode *)0x0) {
    CSynchCache<CorUnix::_ThreadApcInfoNode>::Add
              ((CSynchCache<CorUnix::_ThreadApcInfoNode> *)pObj,pthrCurrent,pobj);
  }
  return PVar3;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::QueueUserAPC(CPalThread * pthrCurrent,
        CPalThread * pthrTarget,
        PAPCFUNC pfnAPC,
        ULONG_PTR uptrData)
    {
        PAL_ERROR palErr = NO_ERROR;
        ThreadApcInfoNode * ptainNode = NULL;
        DWORD dwWaitState;
        DWORD * pdwWaitState;
        ThreadWaitInfo * pTargetTWInfo = GetThreadWaitInfo(pthrTarget);
        bool fLocalSynchLock = false;
        bool fSharedSynchLock = false;
        bool fThreadLock = false;

        ptainNode = m_cacheThreadApcInfoNodes.Get(pthrCurrent);
        if (NULL == ptainNode)
        {
            ERROR("No memory for new APCs linked list entry\n");
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto QUAPC_exit;
        }

        ptainNode->pfnAPC = pfnAPC;
        ptainNode->pAPCData = uptrData;
        ptainNode->pNext = NULL;

        AcquireLocalSynchLock(pthrCurrent);
        fLocalSynchLock = true;

        if (LocalWait != pTargetTWInfo->wdWaitDomain)
        {
            AcquireSharedSynchLock(pthrCurrent);
            fSharedSynchLock = true;
        }

        pthrTarget->Lock(pthrCurrent);
        fThreadLock = true;

        if(TS_DONE == pthrTarget->synchronizationInfo.GetThreadState())
        {
            ERROR("Thread %#x has terminated; can't queue an APC on it\n",
                  pthrTarget->GetThreadId());
            palErr = ERROR_INVALID_PARAMETER;
            goto QUAPC_exit;
        }
        pdwWaitState = SharedIDToTypePointer(DWORD,
            pthrTarget->synchronizationInfo.m_shridWaitAwakened);
        if(TWS_EARLYDEATH == VolatileLoad(pdwWaitState))
        {
            ERROR("Thread %#x is about to be suspended for process shutdown, "
                  "can't queue an APC on it\n", pthrTarget->GetThreadId());
            palErr = ERROR_INVALID_PARAMETER;
            goto QUAPC_exit;
        }

        if (NULL == pthrTarget->apcInfo.m_ptainTail)
        {
            _ASSERT_MSG(NULL == pthrTarget->apcInfo.m_ptainHead,
                        "Corrupted APC list\n");

            pthrTarget->apcInfo.m_ptainHead = ptainNode;
            pthrTarget->apcInfo.m_ptainTail = ptainNode;
        }
        else
        {
            pthrTarget->apcInfo.m_ptainTail->pNext = ptainNode;
            pthrTarget->apcInfo.m_ptainTail = ptainNode;
        }

        // Set ptainNode to NULL so it won't be readded to the cache
        ptainNode = NULL;

        TRACE("APC %p with parameter %p added to APC queue\n",
             pfnAPC, uptrData);

        dwWaitState = InterlockedCompareExchange((LONG *)pdwWaitState,
                                                 (LONG)TWS_ACTIVE,
                                                 (LONG)TWS_ALERTABLE);

        // Release thread lock
        pthrTarget->Unlock(pthrCurrent);
        fThreadLock = false;

        if(TWS_ALERTABLE == dwWaitState)
        {
            // Unregister the wait
            UnRegisterWait(pthrCurrent, pTargetTWInfo, fSharedSynchLock);

            // Wake up target thread
            palErr = WakeUpLocalThread(
                pthrCurrent,
                pthrTarget,
                Alerted,
                0);

            if (NO_ERROR != palErr)
            {
                ERROR("Failed to wakeup local thread %#x for dispatching "
                      "APCs [err=%u]\n", pthrTarget->GetThreadId(),
                      palErr);
            }
        }

    QUAPC_exit:
        if (fThreadLock)
        {
            pthrTarget->Unlock(pthrCurrent);
        }
        if (fSharedSynchLock)
        {
            ReleaseSharedSynchLock(pthrCurrent);
        }
        if (fLocalSynchLock)
        {
            ReleaseLocalSynchLock(pthrCurrent);
        }
        if (ptainNode)
        {
            m_cacheThreadApcInfoNodes.Add(pthrCurrent, ptainNode);
        }
        return palErr;
    }